

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O0

void __thiscall
detail::vector_push_back_pointer_operator_impl<unsigned_int,_char_*,_true>::operator()
          (vector_push_back_pointer_operator_impl<unsigned_int,_char_*,_true> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v,
          vector_push_back_helper<char_*> info)

{
  size_type sVar1;
  value_type_conflict local_3c;
  ulong uStack_38;
  uint tmp;
  size_t i;
  size_t rshft_num;
  size_t size_time;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_local;
  vector_push_back_pointer_operator_impl<unsigned_int,_char_*,_true> *this_local;
  vector_push_back_helper<char_*> info_local;
  
  rshft_num = 2;
  i = 0x20;
  size_time = (size_t)v;
  v_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  this_local = (vector_push_back_pointer_operator_impl<unsigned_int,_char_*,_true> *)info.value;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(v);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(v,sVar1 + 2);
  for (uStack_38 = 0; uStack_38 < 2; uStack_38 = uStack_38 + 1) {
    local_3c = (value_type_conflict)((ulong)this_local >> ((byte)(uStack_38 << 5) & 0x3f));
    if (local_3c != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)size_time,&local_3c);
    }
  }
  return;
}

Assistant:

void operator()(std::vector<value_type>& v, vector_push_back_helper<T> info) {
			constexpr size_t size_time = sizeof(T) / sizeof(value_type);
			constexpr size_t rshft_num = sizeof(value_type) * CHAR_BIT;
			v.reserve(v.size() + size_time);
			for (size_t i = 0; i < size_time; ++i) {
				if(auto tmp = static_cast<value_type>(((std::uintmax_t)(info.value)) >> (rshft_num * i))) v.push_back(tmp);
			}
		}